

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O3

int Cbs0_ManSolve_rec(Cbs0_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t **__ptr;
  Gia_Obj_t *pGVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  Gia_Obj_t *pGVar15;
  long lVar16;
  bool bVar17;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Cbs0_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                  ,0x24f,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
  }
  iVar7 = Cbs0_ManPropagate(p);
  iVar12 = 1;
  if (iVar7 == 0) {
    iVar7 = (p->pProp).iHead;
    if (iVar7 != (p->pProp).iTail) {
      __assert_fail("Cbs0_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                    ,0x253,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
    }
    iVar2 = (p->pJust).iHead;
    iVar3 = (p->pJust).iTail;
    iVar10 = 0;
    iVar8 = iVar3 - iVar2;
    iVar12 = 0;
    if (iVar8 != 0) {
      iVar12 = (p->Pars).nJustThis;
      if (iVar8 < iVar12) {
        iVar8 = iVar12;
      }
      (p->Pars).nJustThis = iVar8;
      iVar12 = iVar10;
      if ((iVar8 <= (p->Pars).nJustLimit) && ((p->Pars).nBTThis <= (p->Pars).nBTLimit)) {
        lVar14 = (long)iVar3;
        iVar8 = iVar3;
        if (iVar2 < iVar3) {
          lVar16 = (long)iVar2;
          do {
            __ptr = (p->pJust).pData;
            pGVar15 = __ptr[lVar16];
            iVar10 = iVar8;
            if (iVar8 == (p->pJust).nSize) {
              (p->pJust).nSize = iVar8 * 2;
              __ptr = (Gia_Obj_t **)realloc(__ptr,(long)(iVar8 * 2) << 3);
              iVar10 = (p->pJust).iTail;
              (p->pJust).pData = __ptr;
            }
            iVar8 = iVar10 + 1;
            (p->pJust).iTail = iVar8;
            __ptr[iVar10] = pGVar15;
            lVar16 = lVar16 + 1;
          } while (lVar14 != lVar16);
        }
        (p->pJust).iHead = iVar3;
        if ((p->Pars).fUseHighest == 0) {
          if ((p->Pars).fUseLowest == 0) {
            if ((p->Pars).fUseMaxFF == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                            ,0x264,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
            }
            pGVar15 = Cbs0_ManDecideMaxFF(p);
          }
          else if (iVar3 < iVar8) {
            pGVar15 = (Gia_Obj_t *)0x0;
            do {
              pGVar4 = (p->pJust).pData[lVar14];
              if (pGVar4 == (Gia_Obj_t *)0x0) break;
              pGVar9 = pGVar15;
              if (pGVar4 < pGVar15) {
                pGVar9 = pGVar4;
              }
              bVar17 = pGVar15 == (Gia_Obj_t *)0x0;
              pGVar15 = pGVar9;
              if (bVar17) {
                pGVar15 = pGVar4;
              }
              lVar14 = lVar14 + 1;
            } while (iVar8 != lVar14);
          }
          else {
            pGVar15 = (Gia_Obj_t *)0x0;
          }
        }
        else if (iVar3 < iVar8) {
          pGVar15 = (Gia_Obj_t *)0x0;
          do {
            pGVar4 = (p->pJust).pData[lVar14];
            if (pGVar4 == (Gia_Obj_t *)0x0) break;
            if (pGVar15 < pGVar4) {
              pGVar15 = pGVar4;
            }
            lVar14 = lVar14 + 1;
          } while (iVar8 != lVar14);
        }
        else {
          pGVar15 = (Gia_Obj_t *)0x0;
        }
        uVar5 = *(ulong *)pGVar15;
        if (((((int)(uint)uVar5 < 0) || (uVar11 = (uint)uVar5 & 0x1fffffff, uVar11 == 0x1fffffff))
            || ((pGVar15[-(ulong)uVar11].field_0x3 & 0x40) != 0)) ||
           (uVar13 = (ulong)((uint)(uVar5 >> 0x20) & 0x1fffffff),
           (pGVar15[-uVar13].field_0x3 & 0x40) != 0)) {
          __assert_fail("Cbs0_VarIsJust( pVar )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x265,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
        }
        pGVar4 = pGVar15 + -(ulong)uVar11;
        pGVar6 = p->pAig;
        pGVar9 = pGVar6->pObjs;
        if (((pGVar4 < pGVar9) || (pGVar9 + pGVar6->nObjs <= pGVar4)) ||
           ((pGVar15 = pGVar15 + -uVar13, pGVar15 < pGVar9 || (pGVar9 + pGVar6->nObjs <= pGVar15))))
        {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar10 = pGVar6->pRefs[(int)((ulong)((long)pGVar4 - (long)pGVar9) >> 2) * -0x55555555];
        iVar8 = pGVar6->pRefs[(int)((ulong)((long)pGVar15 - (long)pGVar9) >> 2) * -0x55555555];
        if (iVar8 < iVar10) {
          pGVar15 = pGVar4;
        }
        pGVar15 = (Gia_Obj_t *)
                  ((ulong)((uVar5 >> ((iVar10 <= iVar8) << 5 | 0x1dU) & 1) != 0) ^ (ulong)pGVar15);
        Cbs0_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar15 ^ 1));
        iVar8 = Cbs0_ManSolve_rec(p);
        if (iVar8 != 0) {
          iVar8 = (p->pProp).iTail;
          if (iVar8 < iVar7) {
            __assert_fail("iBound <= p->pProp.iTail",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x1aa,"void Cbs0_ManCancelUntil(Cbs0_Man_t *, int)");
          }
          (p->pProp).iHead = iVar7;
          if (iVar7 < iVar8) {
            lVar14 = (long)iVar7;
            do {
              pGVar4 = (p->pProp).pData[lVar14];
              if (pGVar4 == (Gia_Obj_t *)0x0) break;
              if (((uint)*(ulong *)pGVar4 >> 0x1e & 1) == 0) {
                __assert_fail("pVar->fMark0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                              ,0x54,"void Cbs0_VarUnassign(Gia_Obj_t *)");
              }
              *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffbfffffff;
              lVar14 = lVar14 + 1;
            } while (lVar14 < (p->pProp).iTail);
          }
          (p->pProp).iTail = iVar7;
          (p->pJust).iHead = iVar2;
          (p->pJust).iTail = iVar3;
          Cbs0_ManAssign(p,pGVar15);
          iVar7 = Cbs0_ManSolve_rec(p);
          if (iVar7 != 0) {
            piVar1 = &(p->Pars).nBTThis;
            *piVar1 = *piVar1 + 1;
            iVar12 = 1;
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int Cbs0_ManSolve_rec( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar = NULL, * pDecVar;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_ManPropagate( p ) )
        return 1;
    // check for satisfying assignment
    assert( Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs0_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs0_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs0_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs0_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs0_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs0_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
    // decide on first fanin
    Cbs0_ManAssign( p, pDecVar );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    Cbs0_ManCancelUntil( p, iPropHead );
    Cbs0_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs0_ManAssign( p, Gia_Not(pDecVar) );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    p->Pars.nBTThis++;
    return 1;
}